

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O0

void __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::calc_price
          (uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *des)

{
  byte bVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  istream *piVar5;
  char *pcVar6;
  reference pvVar7;
  ostream *poVar8;
  double dVar9;
  int iStack_6c5b4;
  istringstream aiStack_6c5b0 [384];
  istringstream aiStack_6c430 [384];
  undefined1 auStack_6c2b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v1;
  ifstream file;
  int iStack_6c08c;
  int iStack_6c088;
  int f;
  int b;
  int a;
  string line1;
  istream aiStack_6c050 [8];
  ifstream infile;
  long arr [235] [235];
  int local_74;
  int last;
  int len;
  int k;
  int col;
  int row;
  string num;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *des_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src_local;
  uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::__cxx11::string::string((string *)(num.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&col);
  k = 0;
  std::ifstream::ifstream(aiStack_6c050,"fare.csv",_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cerr,"Unable to open file");
  }
  else {
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (aiStack_6c050,(string *)(num.field_2._M_local_buf + 8));
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2) break;
      last = 0;
      local_74 = 0;
      len = 0;
      iVar4 = std::__cxx11::string::length();
      for (; last != iVar4; last = last + 1) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)((long)&num.field_2 + 8));
        if ((*pcVar6 == ',') || (last == iVar4 + -1)) {
          std::__cxx11::string::append
                    ((string *)&col,(ulong)((long)&num.field_2 + 8),(long)local_74);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          dVar9 = atof(pcVar6);
          arr[(long)k + -1][(long)len + 0xea] = (long)dVar9;
          std::__cxx11::string::clear();
          len = len + 1;
          if (last != iVar4 + -1) {
            local_74 = last + 1;
          }
        }
      }
      k = k + 1;
    }
    std::ifstream::close();
  }
  std::__cxx11::string::string((string *)&b);
  f = 0;
  iStack_6c088 = 0;
  iStack_6c08c = 0;
  std::ifstream::ifstream
            (&v1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"stations.txt",_S_in);
  do {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)
               &v1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&b);
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)auStack_6c2b0,this,(string *)&b,'\t');
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_6c2b0,1);
    _Var3 = std::operator==(pvVar7,src);
    if (_Var3) {
      iStack_6c08c = iStack_6c08c + 1;
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)auStack_6c2b0,0);
      std::__cxx11::istringstream::istringstream(aiStack_6c430,(string *)pvVar7,_S_in);
      std::operator>>((basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      aiStack_6c430,&f);
      std::__cxx11::istringstream::~istringstream(aiStack_6c430);
    }
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_6c2b0,1);
    _Var3 = std::operator==(pvVar7,des);
    if (_Var3) {
      iStack_6c08c = iStack_6c08c + 1;
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)auStack_6c2b0,0);
      std::__cxx11::istringstream::istringstream(aiStack_6c5b0,(string *)pvVar7,_S_in);
      std::operator>>((basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      aiStack_6c5b0,&iStack_6c088);
      std::__cxx11::istringstream::~istringstream(aiStack_6c5b0);
    }
    if (iStack_6c08c == 2) {
      iStack_6c5b4 = 7;
    }
    else {
      iStack_6c5b4 = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_6c2b0);
  } while (iStack_6c5b4 == 0);
  poVar8 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar8,"\t\t\t");
  poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_e91b);
  poVar8 = (ostream *)
           std::ostream::operator<<
                     (poVar8,arr[(long)(f + -1) + -1][(long)(iStack_6c088 + -1) + 0xea]);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ifstream::~ifstream
            (&v1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&b);
  std::ifstream::~ifstream(aiStack_6c050);
  std::__cxx11::string::~string((string *)&col);
  std::__cxx11::string::~string((string *)(num.field_2._M_local_buf + 8));
  return;
}

Assistant:

void calc_price(ver src, ver des) {
      /*fare calculation and prints fare using fare.csv*/
      string line, num;
      int row = 0, col = 0, k = 0, len = 0, last = 0;
      long arr[235][235];
      ifstream infile("fare.csv");//read fare.csv excel database

      if (infile.is_open()) {
        while (getline(infile, line)) {
          // Takes complete row
          // cout << line<< '\n';
          k = 0, last = 0, col = 0;
          len = line.length();
          while (k != len) {
            if (line[k] == ',' || k == len - 1) {
              //for converting string into number
              arr[row][col] = atof(num.append(line, last, k).c_str());
              //Emptying string for getting next data
              num.clear();

              //increasing column number after saving data
              col++;

              if (k != len - 1)
                last = k + 1;
            }
            k++;
          }
          //increase row number for array
          row++;
        }
        //close the file
        infile.close();
      }
      else cerr << "Unable to open file";
      string line1;
      int a = 0, b = 0, f = 0;
      ifstream file("stations.txt");

      while (!file.eof()) {
        getline(file, line1);
        auto v1 = split(line1, '\t');
        if (v1[1] == src) {
          f++;
          std::istringstream(v1[0]) >> a;
        }
        if (v1[1] == des) {
          f++;
          std::istringstream(v1[0]) >> b;
        }
        if (f == 2) //both src and des covered
          break;
      }
      cout << endl << "\t\t\t";
      cout << "--> Fare is: र" << arr[a - 1][b - 1] << endl;
    }